

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O0

int jpc_floorlog2(int x)

{
  int local_10;
  int local_c;
  int y;
  int x_local;
  
  if (0 < x) {
    local_10 = 0;
    for (local_c = x; 1 < local_c; local_c = local_c >> 1) {
      local_10 = local_10 + 1;
    }
    return local_10;
  }
  __assert_fail("x > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x59,"int jpc_floorlog2(int)");
}

Assistant:

int jpc_floorlog2(int x)
{
	int y;

	/* The argument must be positive. */
	assert(x > 0);

	y = 0;
	while (x > 1) {
		x >>= 1;
		++y;
	}
	return y;
}